

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::error(Parser *this,char *message)

{
  TokenType TVar1;
  pointer pcVar2;
  ostream *poVar3;
  runtime_error *this_00;
  stringstream msg;
  undefined4 uStack_224;
  long *local_220 [2];
  long local_210 [2];
  unsigned_long local_200;
  unsigned_long uStack_1f8;
  TokenType local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  unsigned_long local_1c8;
  unsigned_long uStack_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Parse error on line ",0x14);
  TVar1 = (this->currentToken).type;
  pcVar2 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,pcVar2,pcVar2 + (this->currentToken).lexeme._M_string_length);
  local_200 = (this->currentToken).line;
  uStack_1f8 = (this->currentToken).col;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," column ",8);
  local_1f0 = (this->currentToken).type;
  pcVar2 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar2,pcVar2 + (this->currentToken).lexeme._M_string_length);
  local_1c8 = (this->currentToken).line;
  uStack_1c0 = (this->currentToken).col;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n\t",3);
  std::operator<<(poVar3,message);
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(char *)CONCAT44(uStack_224,TVar1));
  *(undefined ***)this_00 = &PTR__runtime_error_0012e788;
  __cxa_throw(this_00,&ParseException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::error(const char *message) {
    std::stringstream msg;
    msg << "Parse error on line " << token().line <<  " column " << token().col << ":\n\t" << message;
    throw ParseException(msg.str().c_str());
}